

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPAllocatorClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPAllocatorClause *this)

{
  bool bVar1;
  string clause_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  allocator<char> local_48 [8];
  ulong local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"allocator ",local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"(",(allocator<char> *)&bStack_68);
  if (this->allocator < OMPC_ALLOCATOR_ALLOCATOR_user) {
    std::__cxx11::string::append((char *)local_48);
  }
  std::__cxx11::string::string((string *)&bStack_68,(string *)&this->user_defined_allocator);
  bVar1 = std::operator!=(&bStack_68,"");
  std::__cxx11::string::~string((string *)&bStack_68);
  if (bVar1) {
    std::__cxx11::string::string((string *)&bStack_68,(string *)&this->user_defined_allocator);
    std::__cxx11::string::append((string *)local_48);
    std::__cxx11::string::~string((string *)&bStack_68);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&bStack_68,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::append((char *)local_48);
  if (2 < local_40) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPAllocatorClause::toString() {

    std::string result = "allocator ";
    std::string clause_string = "(";
    OpenMPAllocatorClauseAllocator allocator = this->getAllocator();
    switch (allocator) {
        case OMPC_ALLOCATOR_ALLOCATOR_default:
            clause_string += "omp_default_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_large_cap:
            clause_string += "omp_large_cap_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_cons_mem:
            clause_string += "omp_const_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_high_bw:
            clause_string += "omp_high_bw_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_low_lat:
            clause_string += "omp_low_lat_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_cgroup:
            clause_string += "omp_cgroup_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_pteam:
            clause_string += "omp_pteam_mem_alloc";
            break;
        case OMPC_ALLOCATOR_ALLOCATOR_thread:
            clause_string += "omp_thread_mem_alloc";
            break;
        default:
            ;
    }
   if (this->getUserDefinedAllocator() != ""){
        clause_string += this->getUserDefinedAllocator();
    }
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 2) {
        result += clause_string;
    };


    return result;
}